

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rsgVariableManager.cpp
# Opt level: O0

void __thiscall rsg::SubValueRangeIterator::next(SubValueRangeIterator *this)

{
  Type TVar1;
  VariableType *pVVar2;
  vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_> *this_00;
  size_type sVar3;
  ConstValueRangeAccess local_68;
  int local_50;
  int local_4c;
  int ndx_1;
  int numMembers;
  int local_30;
  int local_2c;
  int ndx;
  int numElements;
  ConstValueRangeAccess curItem;
  SubValueRangeIterator *this_local;
  
  curItem.m_max = (Scalar *)this;
  getItem((ConstValueRangeAccess *)&ndx,this);
  std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::pop_back
            (&this->m_stack);
  pVVar2 = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&ndx);
  TVar1 = VariableType::getBaseType(pVVar2);
  if (TVar1 == TYPE_STRUCT) {
    pVVar2 = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&ndx);
    this_00 = VariableType::getMembers(pVVar2);
    sVar3 = std::vector<rsg::VariableType::Member,_std::allocator<rsg::VariableType::Member>_>::size
                      (this_00);
    local_4c = (int)sVar3;
    for (local_50 = 0; local_50 < local_4c; local_50 = local_50 + 1) {
      ConstValueRangeAccess::member(&local_68,(ConstValueRangeAccess *)&ndx,local_50);
      std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::
      push_back(&this->m_stack,&local_68);
    }
  }
  else if (TVar1 == TYPE_ARRAY) {
    pVVar2 = ConstValueRangeAccess::getType((ConstValueRangeAccess *)&ndx);
    local_2c = VariableType::getNumElements(pVVar2);
    for (local_30 = 0; local_30 < local_2c; local_30 = local_30 + 1) {
      ConstValueRangeAccess::member
                ((ConstValueRangeAccess *)&ndx_1,(ConstValueRangeAccess *)&ndx,local_30);
      std::vector<rsg::ConstValueRangeAccess,_std::allocator<rsg::ConstValueRangeAccess>_>::
      push_back(&this->m_stack,(value_type *)&ndx_1);
    }
  }
  return;
}

Assistant:

void SubValueRangeIterator::next (void)
{
	ConstValueRangeAccess curItem = getItem();
	m_stack.pop_back(); // Remove current

	switch (curItem.getType().getBaseType())
	{
		case VariableType::TYPE_ARRAY:
		{
			int numElements = curItem.getType().getNumElements();
			for (int ndx = 0; ndx < numElements; ndx++)
				m_stack.push_back(curItem.member(ndx));
			break;
		}

		case VariableType::TYPE_STRUCT:
		{
			int numMembers = (int)curItem.getType().getMembers().size();
			for (int ndx = 0; ndx < numMembers; ndx++)
				m_stack.push_back(curItem.member(ndx));
			break;
		}

		default:
			break; // \todo [2011-02-03 pyry] Swizzle control?
	}
}